

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkFromGlobalBdds(Abc_Ntk_t *pNtk,int fReverse)

{
  int nCapMin;
  int iVar1;
  uint uVar2;
  int iVar3;
  DdManager *ddDestination;
  void *pvVar4;
  DdManager *ddSource;
  Abc_Obj_t *pAVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  DdNode *n;
  DdNode *n_00;
  Vec_Att_t *p;
  void **ppvVar8;
  Abc_Ntk_t *pAVar9;
  ProgressBar *p_00;
  Abc_Obj_t *pAVar10;
  char *__s1;
  char *__s2;
  char *pString;
  int iVar11;
  
  ddDestination = (DdManager *)Abc_NtkGlobalBddMan(pNtk);
  pAVar9 = pNtk->pExdc;
  if (pAVar9 != (Abc_Ntk_t *)0x0) {
    if (pAVar9->ntkType != ABC_NTK_STRASH) {
      __assert_fail("Abc_NtkIsStrash(pNtk->pExdc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCollapse.c"
                    ,0x93,"Abc_Ntk_t *Abc_NtkFromGlobalBdds(Abc_Ntk_t *, int)");
    }
    if (pAVar9->vCos->nSize != 1) {
      __assert_fail("Abc_NtkCoNum(pNtk->pExdc) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCollapse.c"
                    ,0x94,"Abc_Ntk_t *Abc_NtkFromGlobalBdds(Abc_Ntk_t *, int)");
    }
    iVar11 = 0;
    pvVar4 = Abc_NtkBuildGlobalBdds(pAVar9,10000000,1,1,0,0);
    if (pvVar4 == (void *)0x0) {
      return (Abc_Ntk_t *)0x0;
    }
    ddSource = (DdManager *)Abc_NtkGlobalBddMan(pNtk->pExdc);
    pAVar5 = Abc_NtkCo(pNtk->pExdc,0);
    pDVar6 = (DdNode *)Abc_ObjGlobalBdd(pAVar5);
    pDVar6 = Cudd_bddTransfer(ddSource,ddDestination,pDVar6);
    Cudd_Ref(pDVar6);
    Abc_NtkFreeGlobalBdds(pNtk->pExdc,1);
    for (; iVar11 < pNtk->vCos->nSize; iVar11 = iVar11 + 1) {
      pAVar5 = Abc_NtkCo(pNtk,iVar11);
      pDVar7 = (DdNode *)Abc_ObjGlobalBdd(pAVar5);
      n = Cudd_bddAnd(ddDestination,pDVar7,(DdNode *)((ulong)pDVar6 ^ 1));
      Cudd_Ref(n);
      n_00 = Cudd_bddAnd(ddDestination,(DdNode *)((ulong)pDVar7 ^ 1),(DdNode *)((ulong)pDVar6 ^ 1));
      Cudd_Ref(n_00);
      Cudd_RecursiveDeref(ddDestination,pDVar7);
      pDVar7 = Cudd_bddIsop(ddDestination,n,(DdNode *)((ulong)n_00 ^ 1));
      Cudd_Ref(pDVar7);
      Cudd_RecursiveDeref(ddDestination,n);
      Cudd_RecursiveDeref(ddDestination,n_00);
      p = (Vec_Att_t *)Abc_NtkGlobalBdd(pAVar5->pNtk);
      ppvVar8 = p->pArrayPtr;
      if (ppvVar8 == (void **)0x0) {
        __assert_fail("p->pArrayPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecAtt.h"
                      ,0xe5,"void Vec_AttWriteEntry(Vec_Att_t *, int, void *)");
      }
      if (p->pFuncStartObj != (_func_void_ptr_void_ptr *)0x0) {
        __assert_fail("p->pFuncStartObj == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecAtt.h"
                      ,0xe6,"void Vec_AttWriteEntry(Vec_Att_t *, int, void *)");
      }
      iVar3 = pAVar5->Id;
      if (p->nCap <= iVar3) {
        iVar1 = p->nCap * 2;
        nCapMin = iVar3 + 10;
        if (iVar3 < iVar1) {
          nCapMin = iVar1;
        }
        Vec_AttGrow(p,nCapMin);
        ppvVar8 = p->pArrayPtr;
      }
      ppvVar8[iVar3] = pDVar7;
    }
    Cudd_RecursiveDeref(ddDestination,pDVar6);
  }
  pAVar9 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_BDD);
  Cudd_bddIthVar((DdManager *)pAVar9->pManFunc,ddDestination->size + -1);
  p_00 = Extra_ProgressBarStart(_stdout,pNtk->vCos->nSize);
  iVar11 = 0;
  do {
    if (pNtk->vCos->nSize <= iVar11) {
      Extra_ProgressBarStop(p_00);
      return pAVar9;
    }
    pAVar10 = Abc_NtkCo(pNtk,iVar11);
    Extra_ProgressBarUpdate(p_00,iVar11,pString);
    pAVar5 = (Abc_Obj_t *)pAVar10->pNtk->vObjs->pArray[*(pAVar10->vFanins).pArray];
    uVar2 = *(uint *)&pAVar5->field_0x14 & 0xf;
    if ((uVar2 == 5) || (uVar2 == 2)) {
      __s1 = Abc_ObjName(pAVar10);
      __s2 = Abc_ObjName(pAVar5);
      iVar3 = strcmp(__s1,__s2);
      if (iVar3 != 0) goto LAB_0026b16d;
      pAVar10 = (pAVar10->field_6).pCopy;
      pAVar5 = (pAVar5->field_6).pCopy;
    }
    else {
LAB_0026b16d:
      pDVar6 = (DdNode *)Abc_ObjGlobalBdd(pAVar10);
      pAVar5 = Abc_NodeFromGlobalBdds(pAVar9,ddDestination,pDVar6,fReverse);
      pAVar10 = (pAVar10->field_6).pCopy;
    }
    Abc_ObjAddFanin(pAVar10,pAVar5);
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkFromGlobalBdds( Abc_Ntk_t * pNtk, int fReverse )
{
    ProgressBar * pProgress;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pNode, * pDriver, * pNodeNew;
    DdManager * dd = (DdManager *)Abc_NtkGlobalBddMan( pNtk );
    int i;

    // extract don't-care and compute ISOP
    if ( pNtk->pExdc )
    {
        DdManager * ddExdc = NULL;
        DdNode * bBddMin, * bBddDc, * bBddL, * bBddU;
        assert( Abc_NtkIsStrash(pNtk->pExdc) );
        assert( Abc_NtkCoNum(pNtk->pExdc) == 1 );
        // compute the global BDDs
        if ( Abc_NtkBuildGlobalBdds(pNtk->pExdc, 10000000, 1, 1, 0, 0) == NULL )
            return NULL;
        // transfer tot the same manager
        ddExdc = (DdManager *)Abc_NtkGlobalBddMan( pNtk->pExdc );
        bBddDc = (DdNode *)Abc_ObjGlobalBdd(Abc_NtkCo(pNtk->pExdc, 0));
        bBddDc = Cudd_bddTransfer( ddExdc, dd, bBddDc );  Cudd_Ref( bBddDc );
        Abc_NtkFreeGlobalBdds( pNtk->pExdc, 1 );
        // minimize the output
        Abc_NtkForEachCo( pNtk, pNode, i )
        {
            bBddMin = (DdNode *)Abc_ObjGlobalBdd(pNode);
            // derive lower and uppwer bound
            bBddL = Cudd_bddAnd( dd, bBddMin,           Cudd_Not(bBddDc) );  Cudd_Ref( bBddL );
            bBddU = Cudd_bddAnd( dd, Cudd_Not(bBddMin), Cudd_Not(bBddDc) );  Cudd_Ref( bBddU );
            Cudd_RecursiveDeref( dd, bBddMin );
            // compute new one
            bBddMin = Cudd_bddIsop( dd, bBddL, Cudd_Not(bBddU) );            Cudd_Ref( bBddMin );
            Cudd_RecursiveDeref( dd, bBddL );
            Cudd_RecursiveDeref( dd, bBddU );
            // update global BDD
            Abc_ObjSetGlobalBdd( pNode, bBddMin );
            //Extra_bddPrint( dd, bBddMin ); printf( "\n" );
        }
        Cudd_RecursiveDeref( dd, bBddDc );
    }

    // start the new network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_BDD );
    // make sure the new manager has the same number of inputs
    Cudd_bddIthVar( (DdManager *)pNtkNew->pManFunc, dd->size-1 );
    // process the POs
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        pDriver = Abc_ObjFanin0(pNode);
        if ( Abc_ObjIsCi(pDriver) && !strcmp(Abc_ObjName(pNode), Abc_ObjName(pDriver)) )
        {
            Abc_ObjAddFanin( pNode->pCopy, pDriver->pCopy );
            continue;
        }
        pNodeNew = Abc_NodeFromGlobalBdds( pNtkNew, dd, (DdNode *)Abc_ObjGlobalBdd(pNode), fReverse );
        Abc_ObjAddFanin( pNode->pCopy, pNodeNew );

    }
    Extra_ProgressBarStop( pProgress );
    return pNtkNew;
}